

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxStaticArrayVariable::FxStaticArrayVariable
          (FxStaticArrayVariable *this,FxLocalVariableDeclaration *var,FScriptPosition *sc)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,sc);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_StaticArrayVariable;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070c6c0;
  this->Variable = (FxStaticArray *)var;
  (this->super_FxExpression).ValueType = (var->super_FxExpression).ValueType;
  return;
}

Assistant:

FxStaticArrayVariable::FxStaticArrayVariable(FxLocalVariableDeclaration *var, const FScriptPosition &sc)
	: FxExpression(EFX_StaticArrayVariable, sc)
{
	Variable = static_cast<FxStaticArray*>(var);
	ValueType = Variable->ValueType;
}